

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::FileReadStream,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          FileReadStream *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Ch CVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  byte *pbVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong i;
  int iVar13;
  uint i_00;
  double d;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  NumberStream<rapidjson::FileReadStream,_false,_false> s;
  double local_78;
  
  pbVar9 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
  s.is = is;
  bVar4 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                    (&s,'-');
  cVar1 = *(s.is)->current_;
  if (cVar1 == '0') {
    FileReadStream::Take(s.is);
    local_78 = 0.0;
    bVar8 = false;
    i = 0;
    iVar13 = 0;
    bVar2 = false;
    bVar3 = false;
    i_00 = 0;
  }
  else {
    if (8 < (byte)(cVar1 - 0x31U)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x5fd,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar9 = (byte *)((s.is)->current_ + ((s.is)->count_ - (long)(s.is)->buffer_));
      *(undefined4 *)(this + 0x30) = 3;
      goto LAB_002801a3;
    }
    CVar5 = FileReadStream::Take(s.is);
    i_00 = (int)CVar5 - 0x30;
    iVar13 = 0;
    if (bVar4) {
LAB_0027fd1f:
      if (9 < (byte)(*(s.is)->current_ - 0x30U)) goto LAB_0027fe09;
      if (i_00 < 0xccccccc) {
LAB_0027fd3e:
        CVar5 = FileReadStream::Take(s.is);
        i_00 = (i_00 * 10 + (int)CVar5) - 0x30;
        iVar13 = iVar13 + 1;
        goto LAB_0027fd1f;
      }
      if (i_00 != 0xccccccc) goto LAB_0027fda9;
      if ((byte)*(s.is)->current_ < 0x39) goto LAB_0027fd3e;
      i_00 = 0xccccccc;
LAB_0027fda9:
      i = (ulong)i_00;
      if (bVar4) {
        while ((byte)(*(s.is)->current_ - 0x30U) < 10) {
          if ((0xccccccccccccccb < i) &&
             ((i != 0xccccccccccccccc || (0x38 < (byte)*(s.is)->current_)))) goto LAB_0027fe78;
          CVar5 = FileReadStream::Take(s.is);
          i = (ulong)((int)CVar5 - 0x30) + i * 10;
          iVar13 = iVar13 + 1;
        }
      }
      else {
        while ((byte)(*(s.is)->current_ - 0x30U) < 10) {
          if ((0x1999999999999998 < i) &&
             ((i != 0x1999999999999999 || (0x35 < (byte)*(s.is)->current_)))) goto LAB_0027fe78;
          CVar5 = FileReadStream::Take(s.is);
          i = (ulong)((int)CVar5 - 0x30) + i * 10;
          iVar13 = iVar13 + 1;
        }
      }
      local_78 = 0.0;
      bVar3 = true;
      bVar8 = false;
      bVar2 = false;
    }
    else {
      while ((byte)(*(s.is)->current_ - 0x30U) < 10) {
        if (0x19999998 < i_00) {
          if (i_00 != 0x19999999) goto LAB_0027fda9;
          if (0x35 < (byte)*(s.is)->current_) {
            i_00 = 0x19999999;
            goto LAB_0027fda9;
          }
        }
        CVar5 = FileReadStream::Take(s.is);
        i_00 = (i_00 * 10 + (int)CVar5) - 0x30;
        iVar13 = iVar13 + 1;
      }
LAB_0027fe09:
      local_78 = 0.0;
      bVar8 = false;
      i = 0;
      bVar2 = false;
      bVar3 = false;
    }
  }
  goto LAB_0027fefc;
LAB_0027fe78:
  auVar14._8_4_ = (int)(i >> 0x20);
  auVar14._0_8_ = i;
  auVar14._12_4_ = 0x45300000;
  local_78 = (auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while ((byte)(*(s.is)->current_ - 0x30U) < 10) {
    CVar5 = FileReadStream::Take(s.is);
    local_78 = local_78 * 10.0 + (double)(CVar5 + -0x30);
  }
  bVar8 = true;
  bVar2 = true;
  bVar3 = true;
LAB_0027fefc:
  bVar6 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                    (&s,'.');
  iVar12 = 0;
  if (bVar6) {
    bVar7 = *(s.is)->current_;
    if ((byte)(bVar7 - 0x3a) < 0xf6) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x628,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar9 = (byte *)((s.is)->current_ + ((s.is)->count_ - (long)(s.is)->buffer_));
      *(undefined4 *)(this + 0x30) = 0xe;
      goto LAB_002801a3;
    }
    iVar12 = 0;
    if (!bVar8) {
      if (!bVar3) {
        i = (ulong)i_00;
      }
      iVar12 = 0;
      while ((('/' < (char)bVar7 && (bVar7 < 0x3a)) && (i >> 0x35 == 0))) {
        CVar5 = FileReadStream::Take(s.is);
        iVar12 = iVar12 + -1;
        i = (ulong)((int)CVar5 - 0x30) + i * 10;
        iVar13 = iVar13 + (uint)(i != 0);
        bVar7 = *(s.is)->current_;
      }
      auVar15._8_4_ = (int)(i >> 0x20);
      auVar15._0_8_ = i;
      auVar15._12_4_ = 0x45300000;
      local_78 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar2 = true;
    }
    while ((byte)(*(s.is)->current_ - 0x30U) < 10) {
      CVar5 = FileReadStream::Take(s.is);
      if (iVar13 < 0x11) {
        local_78 = local_78 * 10.0 + (double)(CVar5 + -0x30);
        iVar12 = iVar12 + -1;
        if (0.0 < local_78) {
          iVar13 = iVar13 + 1;
        }
      }
    }
  }
  bVar8 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                    (&s,'e');
  if (bVar8) {
LAB_0028002c:
    uVar10 = (ulong)i_00;
    if (bVar3) {
      uVar10 = i;
    }
    if (!bVar2) {
      auVar16._8_4_ = (int)(uVar10 >> 0x20);
      auVar16._0_8_ = uVar10;
      auVar16._12_4_ = 0x45300000;
      local_78 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
      bVar2 = true;
    }
    bVar8 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                      (&s,'+');
    if (bVar8) {
      bVar8 = false;
    }
    else {
      bVar8 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                        (&s,'-');
    }
    if (9 < (byte)(*(s.is)->current_ - 0x30U)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x67d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar9 = (byte *)((s.is)->current_ + ((s.is)->count_ - (long)(s.is)->buffer_));
      *(undefined4 *)(this + 0x30) = 0xf;
      goto LAB_002801a3;
    }
    CVar5 = FileReadStream::Take(s.is);
    iVar11 = CVar5 + -0x30;
    if (bVar8 == false) {
      do {
        if (9 < (byte)(*(s.is)->current_ - 0x30U)) goto LAB_00280159;
        CVar5 = FileReadStream::Take(s.is);
        iVar11 = iVar11 * 10 + (int)CVar5 + -0x30;
      } while (iVar11 <= 0x134 - iVar12);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x678,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_002801a3;
    }
    if (0 < iVar12) {
      __assert_fail("expFrac <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                    ,0x668,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    while ((byte)(*(s.is)->current_ - 0x30U) < 10) {
      CVar5 = FileReadStream::Take(s.is);
      iVar11 = iVar11 * 10 + (int)CVar5 + -0x30;
      if ((iVar12 + 0x7ffffff7) / 10 < iVar11) {
        while ((byte)(*(s.is)->current_ - 0x30U) < 10) {
          FileReadStream::Take(s.is);
        }
      }
    }
LAB_00280159:
    iVar13 = -iVar11;
    if (bVar8 == false) {
      iVar13 = iVar11;
    }
  }
  else {
    bVar8 = Consume<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::NumberStream<rapidjson::FileReadStream,false,false>>
                      (&s,'E');
    iVar13 = 0;
    if (bVar8) goto LAB_0028002c;
  }
  if (bVar2) {
    d = internal::StrtodNormalPrecision(local_78,iVar13 + iVar12);
    if (1.79769313486232e+308 < d) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                      ,0x6ac,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      goto LAB_002801a3;
    }
    if (bVar4) {
      d = -d;
    }
    bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Double(handler,d);
  }
  else if (bVar3) {
    if (bVar4) {
      bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int64(handler,-i);
    }
    else {
      bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint64(handler,i);
    }
  }
  else if (bVar4) {
    bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int(handler,-i_00);
  }
  else {
    bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Uint(handler,i_00);
  }
  if (bVar4 != false) {
    return;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/rapidjson/reader.h"
                  ,0x6c4,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::FileReadStream, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_002801a3:
  *(byte **)(this + 0x38) = pbVar9;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }